

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

char16 * Output::CaptureEnd(void)

{
  char *pcVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  pcVar1 = (char *)*in_FS_OFFSET;
  if (*pcVar1 == '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                       ,0x28b,"(s_capture)","s_capture");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  *pcVar1 = '\0';
  return (char16 *)0x0;
}

Assistant:

char16 *
Output::CaptureEnd()
{
    Assert(s_capture);
    s_capture = false;
#ifdef _WIN32
    bufferFreeSize = 0;
    bufferAllocSize = 0;
    char16 * returnBuffer = buffer;
    buffer = nullptr;
#else
    char16 * returnBuffer = nullptr;
#endif

    return returnBuffer;
}